

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O3

string * __thiscall Object::asString_abi_cxx11_(string *__return_storage_ptr__,Object *this)

{
  string local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{\n","");
  Environment::toString_abi_cxx11_(&local_38,&this->members,true);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string Object::asString() {
    std::string result = "{\n";
    result += members.toString(true);
    result += "}";
    return result;
}